

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

void xmlNodeSetName(xmlNodePtr cur,xmlChar *name)

{
  int iVar1;
  xmlChar *pxVar2;
  _xmlDict *dict;
  xmlChar *str;
  
  if (name == (xmlChar *)0x0 || cur == (xmlNodePtr)0x0) {
    return;
  }
  if ((cur->type < (XML_XINCLUDE_END|XML_ELEMENT_NODE)) &&
     ((0x1c3d18U >> (cur->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)) {
    return;
  }
  if (cur->doc == (_xmlDoc *)0x0) {
    dict = (xmlDictPtr)0x0;
  }
  else {
    dict = cur->doc->dict;
  }
  str = cur->name;
  if (dict == (xmlDictPtr)0x0) {
    pxVar2 = xmlStrdup(name);
  }
  else {
    if ((str == (xmlChar *)0x0) || (iVar1 = xmlDictOwns(dict,str), iVar1 != 0)) {
      str = (xmlChar *)0x0;
    }
    else {
      str = cur->name;
    }
    pxVar2 = xmlDictLookup(dict,name,-1);
  }
  cur->name = pxVar2;
  if (str == (xmlChar *)0x0) {
    return;
  }
  (*xmlFree)(str);
  return;
}

Assistant:

void
xmlNodeSetName(xmlNodePtr cur, const xmlChar *name) {
    xmlDocPtr doc;
    xmlDictPtr dict;
    const xmlChar *freeme = NULL;

    if (cur == NULL) return;
    if (name == NULL) return;
    switch(cur->type) {
        case XML_TEXT_NODE:
        case XML_CDATA_SECTION_NODE:
        case XML_COMMENT_NODE:
        case XML_DOCUMENT_TYPE_NODE:
        case XML_DOCUMENT_FRAG_NODE:
        case XML_NOTATION_NODE:
        case XML_HTML_DOCUMENT_NODE:
	case XML_NAMESPACE_DECL:
	case XML_XINCLUDE_START:
	case XML_XINCLUDE_END:
	    return;
        case XML_ELEMENT_NODE:
        case XML_ATTRIBUTE_NODE:
        case XML_PI_NODE:
        case XML_ENTITY_REF_NODE:
        case XML_ENTITY_NODE:
        case XML_DTD_NODE:
        case XML_DOCUMENT_NODE:
        case XML_ELEMENT_DECL:
        case XML_ATTRIBUTE_DECL:
        case XML_ENTITY_DECL:
	    break;
    }
    doc = cur->doc;
    if (doc != NULL)
	dict = doc->dict;
    else
        dict = NULL;
    if (dict != NULL) {
        if ((cur->name != NULL) && (!xmlDictOwns(dict, cur->name)))
	    freeme = cur->name;
	cur->name = xmlDictLookup(dict, name, -1);
    } else {
	if (cur->name != NULL)
	    freeme = cur->name;
	cur->name = xmlStrdup(name);
    }

    if (freeme)
        xmlFree((xmlChar *) freeme);
}